

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O3

int yy_suffix(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *cclass;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *cclass_00;
  int yypos57;
  code *pcVar5;
  char *pcVar6;
  int yypos46;
  int iVar7;
  int yythunkpos46;
  int yypos0_3;
  int yythunkpos57;
  
  iVar4 = G->pos;
  iVar3 = G->thunkpos;
  iVar1 = yy_identifier(G);
  if (iVar1 == 0) {
LAB_00103729:
    G->pos = iVar4;
    G->thunkpos = iVar3;
    iVar1 = yy_identifier(G);
    if (iVar1 != 0) {
      iVar1 = G->pos;
      iVar7 = G->thunkpos;
      iVar2 = yy_EQUAL(G);
      if (iVar2 == 0) {
        G->pos = iVar1;
        G->thunkpos = iVar7;
        iVar4 = G->begin;
        iVar3 = G->end;
        pcVar5 = yy_3_primary;
        pcVar6 = "yy_3_primary";
        goto LAB_00103abe;
      }
    }
    G->pos = iVar4;
    G->thunkpos = iVar3;
    iVar1 = yymatchChar(G,0x28);
    pcVar6 = extraout_RDX;
    if (iVar1 == 0) {
LAB_0010379e:
      G->pos = iVar4;
      G->thunkpos = iVar3;
      iVar1 = yymatchClass(G,(uchar *)"",pcVar6);
      pcVar6 = extraout_RDX_02;
      if (iVar1 == 0) {
LAB_00103831:
        G->pos = iVar4;
        G->thunkpos = iVar3;
        iVar1 = yymatchClass(G,(uchar *)"",pcVar6);
        if (iVar1 != 0) {
          yyText(G,G->begin,G->end);
          G->begin = G->pos;
          pcVar6 = extraout_RDX_06;
          do {
            iVar1 = G->pos;
            iVar7 = G->thunkpos;
            iVar2 = yymatchClass(G,(uchar *)"",pcVar6);
            if (iVar2 != 0) break;
            G->pos = iVar1;
            G->thunkpos = iVar7;
            iVar2 = yy_char(G);
            pcVar6 = extraout_RDX_07;
          } while (iVar2 != 0);
          G->pos = iVar1;
          G->thunkpos = iVar7;
          yyText(G,G->begin,G->end);
          G->end = G->pos;
          iVar1 = yymatchClass(G,(uchar *)"",cclass_00);
          if (iVar1 != 0) goto LAB_001038c4;
        }
        G->pos = iVar4;
        G->thunkpos = iVar3;
        iVar1 = yymatchChar(G,0x5b);
        if (iVar1 != 0) {
          yyText(G,G->begin,G->end);
          iVar1 = G->pos;
          iVar7 = G->thunkpos;
          G->begin = iVar1;
          while (iVar2 = yymatchChar(G,0x5d), iVar2 == 0) {
            G->pos = iVar1;
            G->thunkpos = iVar7;
            iVar2 = yy_char(G);
            if (((iVar2 == 0) || (iVar2 = yymatchChar(G,0x2d), iVar2 == 0)) ||
               (iVar2 = yy_char(G), iVar2 == 0)) {
              G->pos = iVar1;
              G->thunkpos = iVar7;
              iVar2 = yy_char(G);
              if (iVar2 == 0) break;
            }
            iVar1 = G->pos;
            iVar7 = G->thunkpos;
          }
          G->pos = iVar1;
          G->thunkpos = iVar7;
          yyText(G,G->begin,G->end);
          G->end = G->pos;
          iVar1 = yymatchChar(G,0x5d);
          if (iVar1 != 0) {
            yy__(G);
            iVar4 = G->begin;
            iVar3 = G->end;
            pcVar5 = yy_5_primary;
            pcVar6 = "yy_5_primary";
            goto LAB_00103abe;
          }
        }
        G->pos = iVar4;
        G->thunkpos = iVar3;
        iVar1 = yymatchChar(G,0x2e);
        if (iVar1 == 0) {
          G->pos = iVar4;
          G->thunkpos = iVar3;
          iVar1 = yy_action(G);
          if (iVar1 == 0) {
            G->pos = iVar4;
            G->thunkpos = iVar3;
            iVar1 = yy_BEGIN(G);
            if (iVar1 == 0) {
              G->pos = iVar4;
              G->thunkpos = iVar3;
              iVar1 = yy_END(G);
              if (iVar1 == 0) {
                G->pos = iVar4;
                G->thunkpos = iVar3;
                return 0;
              }
              iVar4 = G->begin;
              iVar3 = G->end;
              pcVar5 = yy_9_primary;
              pcVar6 = "yy_9_primary";
            }
            else {
              iVar4 = G->begin;
              iVar3 = G->end;
              pcVar5 = yy_8_primary;
              pcVar6 = "yy_8_primary";
            }
          }
          else {
            iVar4 = G->begin;
            iVar3 = G->end;
            pcVar5 = yy_7_primary;
            pcVar6 = "yy_7_primary";
          }
        }
        else {
          yy__(G);
          iVar4 = G->begin;
          iVar3 = G->end;
          pcVar5 = yy_6_primary;
          pcVar6 = "yy_6_primary";
        }
      }
      else {
        yyText(G,G->begin,G->end);
        G->begin = G->pos;
        pcVar6 = extraout_RDX_03;
        do {
          iVar1 = G->pos;
          iVar7 = G->thunkpos;
          iVar2 = yymatchClass(G,(uchar *)"",pcVar6);
          if (iVar2 != 0) break;
          G->pos = iVar1;
          G->thunkpos = iVar7;
          iVar2 = yy_char(G);
          pcVar6 = extraout_RDX_04;
        } while (iVar2 != 0);
        G->pos = iVar1;
        G->thunkpos = iVar7;
        yyText(G,G->begin,G->end);
        G->end = G->pos;
        iVar1 = yymatchClass(G,(uchar *)"",cclass);
        pcVar6 = extraout_RDX_05;
        if (iVar1 == 0) goto LAB_00103831;
LAB_001038c4:
        yy__(G);
        iVar4 = G->begin;
        iVar3 = G->end;
        pcVar5 = yy_4_primary;
        pcVar6 = "yy_4_primary";
      }
      goto LAB_00103abe;
    }
    yy__(G);
    iVar1 = yy_expression(G);
    pcVar6 = extraout_RDX_00;
    if ((iVar1 == 0) || (iVar1 = yymatchChar(G,0x29), pcVar6 = extraout_RDX_01, iVar1 == 0))
    goto LAB_0010379e;
    yy__(G);
  }
  else {
    yyDo(G,yy_1_primary,G->begin,G->end,"yy_1_primary");
    iVar1 = yymatchChar(G,0x3a);
    if (iVar1 == 0) goto LAB_00103729;
    yy__(G);
    iVar1 = yy_identifier(G);
    if (iVar1 == 0) goto LAB_00103729;
    iVar1 = G->pos;
    iVar7 = G->thunkpos;
    iVar2 = yy_EQUAL(G);
    if (iVar2 != 0) goto LAB_00103729;
    G->pos = iVar1;
    G->thunkpos = iVar7;
    iVar4 = G->begin;
    iVar3 = G->end;
    pcVar5 = yy_2_primary;
    pcVar6 = "yy_2_primary";
LAB_00103abe:
    yyDo(G,pcVar5,iVar4,iVar3,pcVar6);
  }
  iVar4 = G->pos;
  iVar3 = G->thunkpos;
  iVar1 = yymatchString(G,"~{");
  if (iVar1 != 0) {
    yyText(G,G->begin,G->end);
    G->begin = G->pos;
    do {
      iVar1 = G->pos;
      iVar7 = G->thunkpos;
      iVar2 = yy_braces(G);
    } while (iVar2 != 0);
    G->pos = iVar1;
    G->thunkpos = iVar7;
    yyText(G,G->begin,G->end);
    G->end = G->pos;
    iVar1 = yymatchChar(G,0x7d);
    if (iVar1 != 0) {
      yy__(G);
      yyDo(G,yy_10_primary,G->begin,G->end,"yy_10_primary");
      iVar4 = G->pos;
      iVar3 = G->thunkpos;
      goto LAB_00103b6d;
    }
  }
  G->pos = iVar4;
  G->thunkpos = iVar3;
LAB_00103b6d:
  iVar1 = yymatchChar(G,0x3f);
  if (iVar1 == 0) {
    G->pos = iVar4;
    G->thunkpos = iVar3;
    iVar1 = yymatchChar(G,0x2a);
    if (iVar1 == 0) {
      G->pos = iVar4;
      G->thunkpos = iVar3;
      iVar1 = yymatchChar(G,0x2b);
      if (iVar1 == 0) {
        G->pos = iVar4;
        G->thunkpos = iVar3;
        return 1;
      }
      yy__(G);
      iVar4 = G->begin;
      iVar3 = G->end;
      pcVar5 = yy_3_suffix;
      pcVar6 = "yy_3_suffix";
    }
    else {
      yy__(G);
      iVar4 = G->begin;
      iVar3 = G->end;
      pcVar5 = yy_2_suffix;
      pcVar6 = "yy_2_suffix";
    }
  }
  else {
    yy__(G);
    iVar4 = G->begin;
    iVar3 = G->end;
    pcVar5 = yy_1_suffix;
    pcVar6 = "yy_1_suffix";
  }
  yyDo(G,pcVar5,iVar4,iVar3,pcVar6);
  return 1;
}

Assistant:

YY_RULE(int) yy_suffix(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyprintfv((stderr, "%s\n", "suffix"));
  if (!yy_primary(G))  goto l71;

  {  int yypos72= G->pos, yythunkpos72= G->thunkpos;
  {  int yypos74= G->pos, yythunkpos74= G->thunkpos;  if (!yy_QUESTION(G))  goto l75;
  yyDo(G, yy_1_suffix, G->begin, G->end, "yy_1_suffix");
  goto l74;
  l75:;	  G->pos= yypos74; G->thunkpos= yythunkpos74;  if (!yy_STAR(G))  goto l76;
  yyDo(G, yy_2_suffix, G->begin, G->end, "yy_2_suffix");
  goto l74;
  l76:;	  G->pos= yypos74; G->thunkpos= yythunkpos74;  if (!yy_PLUS(G))  goto l72;
  yyDo(G, yy_3_suffix, G->begin, G->end, "yy_3_suffix");

  }
  l74:;	  goto l73;
  l72:;	  G->pos= yypos72; G->thunkpos= yythunkpos72;
  }
  l73:;	  yyprintf((stderr, "  ok   suffix"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));

  return 1;
  l71:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "suffix"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}